

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_minimum_phase_impulse_response.cc
# Opt level: O2

bool __thiscall
sptk::CepstrumToMinimumPhaseImpulseResponse::Run
          (CepstrumToMinimumPhaseImpulseResponse *this,
          vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *minimum_phase_impulse_response)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  size_type __new_size;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  double dVar12;
  
  if (this->is_valid_ == true) {
    bVar2 = false;
    if ((minimum_phase_impulse_response != (vector<double,_std::allocator<double>_> *)0x0) &&
       (pdVar10 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start, bVar2 = false,
       (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pdVar10 >> 3 ==
       (long)this->num_input_order_ + 1)) {
      pdVar11 = (minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __new_size = (long)this->num_output_order_ + 1;
      if ((long)(minimum_phase_impulse_response->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar11 >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize
                  (minimum_phase_impulse_response,__new_size);
        pdVar10 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (minimum_phase_impulse_response->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      dVar12 = exp(*pdVar10);
      *pdVar11 = dVar12;
      iVar1 = this->num_input_order_;
      iVar3 = 0;
      if (0 < this->num_output_order_) {
        iVar3 = this->num_output_order_;
      }
      pdVar4 = pdVar11;
      for (uVar6 = 1; uVar6 != iVar3 + 1; uVar6 = uVar6 + 1) {
        iVar5 = (int)uVar6;
        iVar7 = iVar5;
        if (iVar1 < iVar5) {
          iVar7 = iVar1;
        }
        dVar12 = 0.0;
        pdVar8 = pdVar4;
        for (uVar9 = 1; (long)uVar9 <= (long)iVar7; uVar9 = uVar9 + 1) {
          dVar12 = dVar12 + (double)(int)uVar9 * pdVar10[uVar9] * *pdVar8;
          pdVar8 = pdVar8 + -1;
        }
        pdVar11[uVar6] = dVar12 / (double)iVar5;
        pdVar4 = pdVar4 + 1;
      }
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool CepstrumToMinimumPhaseImpulseResponse::Run(
    const std::vector<double>& cepstrum,
    std::vector<double>* minimum_phase_impulse_response) const {
  // Check inputs.
  if (!is_valid_ ||
      cepstrum.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == minimum_phase_impulse_response) {
    return false;
  }

  // Prepare memories.
  if (minimum_phase_impulse_response->size() !=
      static_cast<std::size_t>(num_output_order_ + 1)) {
    minimum_phase_impulse_response->resize(num_output_order_ + 1);
  }

  const double* c(&cepstrum[0]);
  double* h(&((*minimum_phase_impulse_response)[0]));

  h[0] = std::exp(c[0]);
  for (int n(1); n <= num_output_order_; ++n) {
    double sum(0.0);
    const int end((num_input_order_ < n) ? num_input_order_ : n);
    for (int k(1); k <= end; ++k) {
      sum += k * c[k] * h[n - k];
    }
    h[n] = sum / n;
  }

  return true;
}